

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

MSLResourceBinding * __thiscall
spirv_cross::CompilerMSL::get_argument_buffer_resource
          (CompilerMSL *this,uint32_t desc_set,uint32_t arg_idx)

{
  ExecutionModel EVar1;
  SPIREntryPoint *pSVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  CompilerError *this_00;
  StageSetBinding bind_tuple;
  StageSetBinding arg_idx_tuple;
  
  pSVar2 = Compiler::get_entry_point((Compiler *)this);
  EVar1 = pSVar2->model;
  arg_idx_tuple.model = EVar1;
  arg_idx_tuple.desc_set = desc_set;
  arg_idx_tuple.binding = arg_idx;
  cVar3 = ::std::
          _Hashtable<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->resource_arg_buff_idx_to_binding_number)._M_h,&arg_idx_tuple);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_true>.
      _M_cur != (__node_type *)0x0) {
    bind_tuple.binding =
         *(uint32_t *)
          ((long)cVar3.
                 super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_true>
                 ._M_cur + 0x14);
    bind_tuple.model = EVar1;
    bind_tuple.desc_set = desc_set;
    cVar4 = ::std::
            _Hashtable<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->resource_bindings)._M_h,&bind_tuple);
    if (cVar4.
        super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      return (MSLResourceBinding *)
             ((long)cVar4.
                    super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                    ._M_cur + 0x14);
    }
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError
            (this_00,
             "Argument buffer resource base type could not be determined. When padding argument buffer elements, all descriptor set resources must be supplied with a base type by the app."
            );
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const MSLResourceBinding &CompilerMSL::get_argument_buffer_resource(uint32_t desc_set, uint32_t arg_idx) const
{
	auto stage = get_entry_point().model;
	StageSetBinding arg_idx_tuple = { stage, desc_set, arg_idx };
	auto arg_itr = resource_arg_buff_idx_to_binding_number.find(arg_idx_tuple);
	if (arg_itr != end(resource_arg_buff_idx_to_binding_number))
	{
		StageSetBinding bind_tuple = { stage, desc_set, arg_itr->second };
		auto bind_itr = resource_bindings.find(bind_tuple);
		if (bind_itr != end(resource_bindings))
			return bind_itr->second.first;
	}
	SPIRV_CROSS_THROW("Argument buffer resource base type could not be determined. When padding argument buffer "
	                  "elements, all descriptor set resources must be supplied with a base type by the app.");
}